

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_notification(Group *this,View *view,bool lock)

{
  View *pVVar1;
  int iVar2;
  mapped_type *this_00;
  Code *pCVar3;
  Code *pCVar4;
  undefined4 extraout_var;
  list<r_code::Code_*> *this_01;
  uint64_t ijt;
  float fVar5;
  float fVar6;
  Code *local_40;
  long *local_38;
  Code *ref;
  uint64_t i;
  byte local_19;
  View *pVStack_18;
  bool lock_local;
  View *view_local;
  Group *this_local;
  
  local_19 = lock;
  pVStack_18 = view;
  view_local = (View *)this;
  if (lock) {
    std::mutex::lock(&this->mutex);
  }
  pVVar1 = pVStack_18;
  i = View::get_oid(pVStack_18);
  this_00 = std::
            unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
            ::operator[](&this->notification_views,&i);
  core::P<r_exec::View>::operator=(this_00,pVVar1);
  ref = (Code *)0x0;
  while( true ) {
    pCVar4 = ref;
    pCVar3 = core::P<r_code::Code>::operator->(&(pVStack_18->super_View).object);
    iVar2 = (*(pCVar3->super__Object)._vptr__Object[10])();
    pVVar1 = pVStack_18;
    if ((Code *)(ulong)(ushort)iVar2 <= pCVar4) break;
    pCVar4 = core::P<r_code::Code>::operator->(&(pVStack_18->super_View).object);
    iVar2 = (*(pCVar4->super__Object)._vptr__Object[9])(pCVar4,(ulong)ref & 0xffff);
    local_38 = (long *)CONCAT44(extraout_var,iVar2);
    (**(code **)(*local_38 + 0x98))();
    this_01 = (list<r_code::Code_*> *)(local_38 + 3);
    local_40 = core::P::operator_cast_to_Code_((P *)&(pVStack_18->super_View).object);
    r_code::list<r_code::Code_*>::push_back(this_01,&local_40);
    (**(code **)(*local_38 + 0xa0))();
    ref = (Code *)((long)&(ref->super__Object)._vptr__Object + 1);
  }
  ijt = (*Now)();
  r_code::View::set_ijt(&pVVar1->super_View,ijt);
  fVar5 = get_c_sln(this);
  fVar6 = get_c_sln_thr(this);
  if (fVar6 < fVar5) {
    fVar5 = View::get_sln(pVStack_18);
    fVar6 = get_sln_thr(this);
    if (fVar6 < fVar5) {
      inject_reduction_jobs(this,pVStack_18);
    }
  }
  if ((local_19 & 1) != 0) {
    std::mutex::unlock(&this->mutex);
  }
  return;
}

Assistant:

void Group::inject_notification(View *view, bool lock)
{
    if (lock) {
        mutex.lock();
    }

    notification_views[view->get_oid()] = view;

    for (uint64_t i = 0; i < view->object->references_size(); ++i) {
        Code *ref = view->object->get_reference(i);
        ref->acq_markers();
        ref->markers.push_back(view->object);
        ref->rel_markers();
    }

    view->set_ijt(Now());

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        inject_reduction_jobs(view);
    }

    if (lock) {
        mutex.unlock();
    }
}